

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O1

Expected<llvm::DWARFDebugNames::AttributeEncoding> __thiscall
llvm::DWARFDebugNames::NameIndex::extractAttributeEncoding(NameIndex *this,uint64_t *Offset)

{
  uint *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  char *Msg;
  uint64_t *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  Expected<llvm::DWARFDebugNames::AttributeEncoding> EVar5;
  error_code EC;
  Error local_30;
  
  if (*in_RDX < Offset[0x12]) {
    uVar2 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),in_RDX,(Error *)0x0);
    uVar3 = DataExtractor::getULEB128((DataExtractor *)(Offset[0xb] + 8),in_RDX,(Error *)0x0);
    puVar1 = &(this->Abbrevs).
              super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
              .TheMap.NumEntries;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
    (this->Abbrevs).
    super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
    .TheMap.Buckets =
         (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)
         (uVar2 & 0xffffffff | (uVar3 & 0xffff) << 0x20);
    uVar4 = extraout_RDX;
  }
  else {
    Msg = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x54;
    EC._0_8_ = &local_30;
    createStringError(EC,Msg);
    Expected<llvm::DWARFDebugNames::AttributeEncoding>::Expected
              ((Expected<llvm::DWARFDebugNames::AttributeEncoding> *)this,&local_30);
    uVar4 = extraout_RDX_00;
    if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
      uVar4 = extraout_RDX_01;
    }
  }
  EVar5._8_8_ = uVar4;
  EVar5.field_0 =
       (anon_union_8_2_427f0595_for_Expected<llvm::DWARFDebugNames::AttributeEncoding>_2)this;
  return EVar5;
}

Assistant:

Expected<DWARFDebugNames::AttributeEncoding>
DWARFDebugNames::NameIndex::extractAttributeEncoding(uint64_t *Offset) {
  if (*Offset >= EntriesBase) {
    return createStringError(errc::illegal_byte_sequence,
                             "Incorrectly terminated abbreviation table.");
  }

  uint32_t Index = Section.AccelSection.getULEB128(Offset);
  uint32_t Form = Section.AccelSection.getULEB128(Offset);
  return AttributeEncoding(dwarf::Index(Index), dwarf::Form(Form));
}